

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

bool __thiscall QDockAreaLayout::restoreDockWidget(QDockAreaLayout *this,QDockWidget *dockWidget)

{
  undefined4 uVar1;
  undefined4 uVar2;
  initializer_list<QDockWidgetPrivate::WindowState> flags;
  QRect rect;
  bool bVar3;
  const_iterator o;
  QDockWidgetGroupWindow **ppQVar4;
  QWidget *widget;
  long *in_RSI;
  QDockAreaLayout *in_RDI;
  long in_FS_OFFSET;
  QPlaceHolderItem *placeHolder;
  QDockWidgetGroupWindow *dwgw;
  QList<QDockWidgetGroupWindow_*> *__range1;
  QDockAreaLayoutItem *item;
  QRect r;
  QList<int> index_1;
  QList<int> index;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QDockWidgetGroupWindow_*> groups;
  undefined4 in_stack_fffffffffffffea8;
  FindChildOption in_stack_fffffffffffffeac;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  QObject *in_stack_fffffffffffffec0;
  QWidget *in_stack_fffffffffffffec8;
  QDockAreaLayout *in_stack_fffffffffffffed0;
  QString *objectName;
  QDockAreaLayoutInfo *in_stack_fffffffffffffee8;
  QRect *rect_00;
  QDockWidgetPrivate *this_00;
  QDockWidgetGroupWindow *in_stack_ffffffffffffff08;
  QFlagsStorage<QDockWidgetPrivate::WindowState> states;
  QDockAreaLayoutItem *local_e8;
  uint in_stack_ffffffffffffff30;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff34;
  const_iterator local_38 [2];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8 = (QDockAreaLayoutItem *)0x0;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  objectName = *(QString **)&in_RDI->mainWindow;
  QFlags<Qt::FindChildOption>::QFlags
            ((QFlags<Qt::FindChildOption> *)
             CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),in_stack_fffffffffffffeac
            );
  QObject::findChildren<QDockWidgetGroupWindow*>
            (in_stack_fffffffffffffec0,
             (QFlagsStorageHelper<Qt::FindChildOption,_4>)
             SUB84((ulong)in_stack_fffffffffffffee8 >> 0x20,0));
  local_38[0].i = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
  local_38[0] = QList<QDockWidgetGroupWindow_*>::begin
                          ((QList<QDockWidgetGroupWindow_*> *)
                           CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  o = QList<QDockWidgetGroupWindow_*>::end
                ((QList<QDockWidgetGroupWindow_*> *)
                 CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  while( true ) {
    states.i = (Int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    bVar3 = QList<QDockWidgetGroupWindow_*>::const_iterator::operator!=(local_38,o);
    if (!bVar3) break;
    ppQVar4 = QList<QDockWidgetGroupWindow_*>::const_iterator::operator*(local_38);
    in_stack_ffffffffffffff08 = *ppQVar4;
    in_stack_fffffffffffffed0 =
         (QDockAreaLayout *)QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x57b035);
    QObject::objectName();
    QDockAreaLayoutInfo::indexOfPlaceHolder(in_stack_fffffffffffffee8,objectName);
    QString::~QString((QString *)0x57b073);
    bVar3 = QList<int>::isEmpty((QList<int> *)0x57b080);
    if (!bVar3) {
      QWidget::setParent((QWidget *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x57b09d);
      local_e8 = QDockAreaLayoutInfo::item
                           ((QDockAreaLayoutInfo *)in_RDI,(QList<int> *)in_stack_fffffffffffffed0);
    }
    QList<int>::~QList((QList<int> *)0x57b0d1);
    states.i = (Int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    if (!bVar3) break;
    QList<QDockWidgetGroupWindow_*>::const_iterator::operator++(local_38);
  }
  if (local_e8 == (QDockAreaLayoutItem *)0x0) {
    QObject::objectName();
    indexOfPlaceHolder(in_RDI,(QString *)in_stack_fffffffffffffed0);
    QString::~QString((QString *)0x57b163);
    bVar3 = QList<int>::isEmpty((QList<int> *)0x57b170);
    if (bVar3) {
      in_stack_ffffffffffffff30 = in_stack_ffffffffffffff30 & 0xffffff;
    }
    else {
      local_e8 = QDockAreaLayout::item
                           (in_stack_fffffffffffffed0,(QList<int> *)in_stack_fffffffffffffec8);
    }
    QList<int>::~QList((QList<int> *)0x57b1b4);
    if (bVar3) goto LAB_0057b33f;
  }
  this_00 = (QDockWidgetPrivate *)local_e8->placeHolderItem;
  widget = (QWidget *)operator_new(0x18);
  QDockWidgetItem::QDockWidgetItem
            ((QDockWidgetItem *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             (QDockWidget *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_e8->widgetItem = (QLayoutItem *)widget;
  if (((this_00->super_QWidgetPrivate).field_0x19 & 1) != 0) {
    uVar1 = *(Representation *)&(this_00->super_QWidgetPrivate).field_0x1c;
    uVar2 = *(Representation *)&(this_00->super_QWidgetPrivate).field_0x20;
    rect.y2.m_i = uVar2;
    rect.x2.m_i = uVar1;
    rect.y1.m_i = in_stack_ffffffffffffff34;
    rect.x1.m_i = in_stack_ffffffffffffff30;
    constrainedRect(rect,widget);
    QDockWidget::d_func((QDockWidget *)0x57b279);
    local_10 = 2;
    local_c = 1;
    rect_00 = (QRect *)0x2;
    flags._M_len = (size_type)in_RDI;
    flags._M_array = in_stack_fffffffffffffed0->corners;
    QFlags<QDockWidgetPrivate::WindowState>::QFlags
              ((QFlags<QDockWidgetPrivate::WindowState> *)widget,flags);
    QDockWidgetPrivate::setWindowState(this_00,(WindowStates)states.i,rect_00);
  }
  (**(code **)(*in_RSI + 0x68))(in_RSI,((this_00->super_QWidgetPrivate).field_0x18 ^ 0xff) & 1);
  local_e8->placeHolderItem = (QPlaceHolderItem *)0x0;
  if (this_00 != (QDockWidgetPrivate *)0x0) {
    QPlaceHolderItem::~QPlaceHolderItem((QPlaceHolderItem *)0x57b320);
    operator_delete(this_00,0x30);
  }
  in_stack_ffffffffffffff30 = 0x1000000;
LAB_0057b33f:
  bVar5 = (byte)(in_stack_ffffffffffffff30 >> 0x18);
  QList<QDockWidgetGroupWindow_*>::~QList((QList<QDockWidgetGroupWindow_*> *)0x57b34c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool QDockAreaLayout::restoreDockWidget(QDockWidget *dockWidget)
{
    QDockAreaLayoutItem *item = nullptr;
    const auto groups =
            mainWindow->findChildren<QDockWidgetGroupWindow *>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        QList<int> index = dwgw->layoutInfo()->indexOfPlaceHolder(dockWidget->objectName());
        if (!index.isEmpty()) {
            dockWidget->setParent(dwgw);
            item = const_cast<QDockAreaLayoutItem *>(&dwgw->layoutInfo()->item(index));
            break;
        }
    }
    if (!item) {
        QList<int> index = indexOfPlaceHolder(dockWidget->objectName());
        if (index.isEmpty())
            return false;
        item = const_cast<QDockAreaLayoutItem *>(&this->item(index));
    }

    QPlaceHolderItem *placeHolder = item->placeHolderItem;
    Q_ASSERT(placeHolder != nullptr);

    item->widgetItem = new QDockWidgetItem(dockWidget);

    if (placeHolder->window) {
        const QRect r = constrainedRect(placeHolder->topLevelRect, dockWidget);
        dockWidget->d_func()->setWindowState(QDockWidgetPrivate::WindowStates(
                                            {QDockWidgetPrivate::WindowState::Floating,
                                             QDockWidgetPrivate::WindowState::Unplug}), r);
    }
    dockWidget->setVisible(!placeHolder->hidden);

    item->placeHolderItem = nullptr;
    delete placeHolder;

    return true;
}